

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O0

Pass * wasm::createReorderGlobalsAlwaysPass(void)

{
  ReorderGlobals *this;
  
  this = (ReorderGlobals *)operator_new(0x60);
  ReorderGlobals::ReorderGlobals(this,true);
  return &this->super_Pass;
}

Assistant:

Pass* createReorderGlobalsAlwaysPass() { return new ReorderGlobals(true); }